

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_affine_avx2.c
# Opt level: O2

void av1_highbd_warp_affine_avx2
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  undefined1 (*pauVar26) [32];
  undefined2 uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  undefined2 uVar39;
  long lVar40;
  short sVar41;
  int k;
  int iVar42;
  int iVar43;
  long lVar44;
  uint uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  ushort uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  int32_t tmp1 [8];
  __m256i tmp [15];
  int local_3f4;
  int local_3dc;
  undefined1 local_260 [32];
  undefined1 local_240 [224];
  undefined1 local_160 [304];
  
  uVar4 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar20 = 0xe - uVar4;
    uVar34 = conv_params->round_1;
  }
  else {
    uVar34 = conv_params->round_1;
    uVar20 = uVar34;
  }
  bVar7 = (byte)uVar4;
  bVar6 = (byte)bd;
  uVar45 = 0xe - (uVar34 + uVar4);
  uVar39 = 0xff;
  if (bd == 0xc) {
    uVar39 = 0xfff;
  }
  uVar27 = 0x3ff;
  if (bd != 10) {
    uVar27 = uVar39;
  }
  bVar19 = (bVar6 + 0xe) - (char)(uVar34 + uVar4);
  iVar42 = (1 << ((byte)uVar20 & 0x1f)) >> 1;
  iVar32 = ((1 << ((byte)uVar45 & 0x1f)) >> 1) +
           (-1 << (bVar19 - 1 & 0x1f)) + (-1 << (bVar19 & 0x1f));
  iVar1 = conv_params->fwd_offset;
  iVar2 = conv_params->bck_offset;
  iVar28 = 1 << (bVar6 + 6 & 0x1f);
  iVar12 = (1 << (bVar7 - 1 & 0x1f)) + iVar28;
  iVar36 = (int)alpha;
  iVar43 = (1 << ((bVar6 + 0xe) - bVar7 & 0x1f)) + iVar42;
  iVar13 = 1 << ((bVar7 ^ 0xff) + bVar6 + 7 & 0x1f);
  iVar29 = (int)beta;
  iVar42 = (-1 << ((bVar6 + (byte)uVar20) - 1 & 0x1f)) + iVar42;
  iVar33 = (int)gamma;
  uVar8 = (ushort)(-1 << (bVar6 & 0x1f));
  uVar68 = uVar8 ^ 0xffff;
  iVar21 = iVar29 * -3 + 0x10200;
  auVar47._4_4_ = iVar12;
  auVar47._0_4_ = iVar12;
  auVar47._8_4_ = iVar12;
  auVar47._12_4_ = iVar12;
  auVar47._16_4_ = iVar12;
  auVar47._20_4_ = iVar12;
  auVar47._24_4_ = iVar12;
  auVar47._28_4_ = iVar12;
  auVar65._4_4_ = iVar43;
  auVar65._0_4_ = iVar43;
  auVar65._8_4_ = iVar43;
  auVar65._12_4_ = iVar43;
  auVar65._16_4_ = iVar43;
  auVar65._20_4_ = iVar43;
  auVar65._24_4_ = iVar43;
  auVar65._28_4_ = iVar43;
  auVar66._4_4_ = iVar32;
  auVar66._0_4_ = iVar32;
  auVar66._8_4_ = iVar32;
  auVar66._12_4_ = iVar32;
  auVar66._16_4_ = iVar32;
  auVar66._20_4_ = iVar32;
  auVar66._24_4_ = iVar32;
  auVar66._28_4_ = iVar32;
  auVar67._4_4_ = iVar42;
  auVar67._0_4_ = iVar42;
  auVar67._8_4_ = iVar42;
  auVar67._12_4_ = iVar42;
  auVar67._16_4_ = iVar42;
  auVar67._20_4_ = iVar42;
  auVar67._24_4_ = iVar42;
  auVar67._28_4_ = iVar42;
  auVar69._0_8_ = CONCAT26(uVar8,CONCAT24(uVar8,CONCAT22(uVar8,uVar8))) ^ 0xffffffffffffffff;
  auVar69._8_2_ = uVar68;
  auVar69._10_2_ = uVar68;
  auVar69._12_2_ = uVar68;
  auVar69._14_2_ = uVar68;
  iVar12 = height + -1;
  lVar16 = (long)height;
  auVar5 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
  iVar32 = width + -1;
  local_3f4 = 0;
  iVar42 = 0;
  do {
    iVar43 = p_height - iVar42;
    if (iVar43 == 0 || p_height < iVar42) {
      return;
    }
    lVar24 = (long)(iVar42 + p_row + 4 << ((byte)subsampling_y & 0x1f));
    if (7 < iVar43) {
      iVar43 = 8;
    }
    lVar25 = (long)iVar43;
    local_3dc = local_3f4;
    for (iVar23 = 0; iVar23 < p_width; iVar23 = iVar23 + 8) {
      lVar17 = (long)(p_col + 4 + iVar23 << ((byte)subsampling_x & 0x1f));
      lVar37 = (long)mat[1] + mat[5] * lVar24 + mat[4] * lVar17 >> ((byte)subsampling_y & 0x3f);
      uVar34 = (uint)((long)*mat + mat[3] * lVar24 + mat[2] * lVar17 >> ((byte)subsampling_x & 0x3f)
                     );
      iVar22 = (int)uVar34 >> 0x10;
      sVar41 = (short)((ulong)lVar37 >> 0x10);
      if (iVar22 < -6) {
        lVar31 = (long)sVar41 + -7;
        pauVar26 = (undefined1 (*) [32])local_240;
        for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
          iVar22 = iVar12;
          if (lVar31 < lVar16) {
            iVar22 = (int)lVar31;
          }
          if (lVar31 < 0) {
            iVar22 = 0;
          }
          auVar59._0_2_ = (undefined2)(((uint)ref[iVar22 * stride] << (7 - bVar7 & 0x1f)) + iVar13);
          auVar59._2_2_ = auVar59._0_2_;
          auVar59._4_2_ = auVar59._0_2_;
          auVar59._6_2_ = auVar59._0_2_;
          auVar59._8_2_ = auVar59._0_2_;
          auVar59._10_2_ = auVar59._0_2_;
          auVar59._12_2_ = auVar59._0_2_;
          auVar59._14_2_ = auVar59._0_2_;
          auVar64 = vpmovsxwd_avx2(auVar59);
          *pauVar26 = auVar64;
          lVar31 = lVar31 + 1;
          pauVar26 = pauVar26 + 1;
        }
      }
      else if (iVar22 < width + 6) {
        uVar34 = (uVar34 & 0xfffc) + (iVar29 + iVar36) * -4 & 0xffffffc0;
        iVar35 = uVar34 + 0x10200;
        if (width < iVar22 + 9 || iVar22 < 7) {
          for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
            iVar14 = (int)(sVar41 + lVar17);
            iVar38 = iVar12;
            if (iVar14 < iVar12) {
              iVar38 = iVar14;
            }
            if (sVar41 + lVar17 < 0) {
              iVar38 = 0;
            }
            iVar14 = ((int)lVar17 + 4) * iVar29 + iVar35;
            lVar18 = (long)iVar22 + -7;
            for (lVar31 = -4; lVar31 != 4; lVar31 = lVar31 + 1) {
              lVar40 = lVar18;
              iVar15 = iVar28;
              for (lVar44 = 0; lVar44 != 0x10; lVar44 = lVar44 + 2) {
                iVar30 = iVar32;
                if ((int)lVar40 < iVar32) {
                  iVar30 = (int)lVar40;
                }
                if (lVar40 < 0) {
                  iVar30 = 0;
                }
                iVar15 = iVar15 + (int)*(short *)((long)av1_warped_filter[iVar14 >> 10] + lVar44) *
                                  (uint)ref[iVar30 + iVar38 * stride];
                lVar40 = lVar40 + 1;
              }
              *(int *)(local_260 + (ulong)(((uint)lVar31 + 4 >> 1) + ((uint)lVar31 & 1) * 4) * 4) =
                   iVar15 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f);
              iVar14 = iVar14 + iVar36;
              lVar18 = lVar18 + 1;
            }
            *(undefined1 (*) [32])(local_160 + lVar17 * 0x20) = local_260;
          }
        }
        else {
          auVar46 = ZEXT416(uVar4);
          iVar38 = iVar35 >> 10;
          if (beta == 0 && alpha == 0) {
            uVar3 = *(undefined4 *)av1_warped_filter[iVar38];
            auVar73._4_4_ = uVar3;
            auVar73._0_4_ = uVar3;
            auVar73._8_4_ = uVar3;
            auVar73._12_4_ = uVar3;
            auVar73._16_4_ = uVar3;
            auVar73._20_4_ = uVar3;
            auVar73._24_4_ = uVar3;
            auVar73._28_4_ = uVar3;
            uVar3 = *(undefined4 *)(av1_warped_filter[iVar38] + 2);
            auVar76._4_4_ = uVar3;
            auVar76._0_4_ = uVar3;
            auVar76._8_4_ = uVar3;
            auVar76._12_4_ = uVar3;
            auVar76._16_4_ = uVar3;
            auVar76._20_4_ = uVar3;
            auVar76._24_4_ = uVar3;
            auVar76._28_4_ = uVar3;
            uVar3 = *(undefined4 *)(av1_warped_filter[iVar38] + 4);
            auVar77._4_4_ = uVar3;
            auVar77._0_4_ = uVar3;
            auVar77._8_4_ = uVar3;
            auVar77._12_4_ = uVar3;
            auVar77._16_4_ = uVar3;
            auVar77._20_4_ = uVar3;
            auVar77._24_4_ = uVar3;
            auVar77._28_4_ = uVar3;
            uVar3 = *(undefined4 *)(av1_warped_filter[iVar38] + 6);
            auVar64._4_4_ = uVar3;
            auVar64._0_4_ = uVar3;
            auVar64._8_4_ = uVar3;
            auVar64._12_4_ = uVar3;
            auVar64._16_4_ = uVar3;
            auVar64._20_4_ = uVar3;
            auVar64._24_4_ = uVar3;
            auVar64._28_4_ = uVar3;
            lVar31 = (long)sVar41 + -7;
            pauVar26 = (undefined1 (*) [32])local_240;
            for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
              iVar35 = iVar12;
              if (lVar31 < lVar16) {
                iVar35 = (int)lVar31;
              }
              if (lVar31 < 0) {
                iVar35 = 0;
              }
              lVar18 = (long)(iVar35 * stride + iVar22);
              auVar52._16_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar52._0_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar49 = vpalignr_avx2(auVar52,*(undefined1 (*) [32])(ref + lVar18 + -7),2);
              auVar70 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar18 + -7),auVar49,0x20);
              auVar61 = vpblendd_avx2(auVar52,auVar49,0xf0);
              auVar52 = vpmaddwd_avx2(auVar73,auVar70);
              auVar49 = vpalignr_avx2(auVar61,auVar70,4);
              auVar53 = vpmaddwd_avx2(auVar76,auVar49);
              auVar49 = vpalignr_avx2(auVar61,auVar70,8);
              auVar58 = vpmaddwd_avx2(auVar77,auVar49);
              auVar49 = vpalignr_avx2(auVar61,auVar70,0xc);
              auVar49 = vpmaddwd_avx2(auVar64,auVar49);
              auVar49 = vpaddd_avx2(auVar58,auVar49);
              auVar52 = vpaddd_avx2(auVar52,auVar47);
              auVar52 = vpaddd_avx2(auVar53,auVar52);
              auVar49 = vpaddd_avx2(auVar52,auVar49);
              auVar49 = vpsrad_avx2(auVar49,auVar46);
              *pauVar26 = auVar49;
              lVar31 = lVar31 + 1;
              pauVar26 = pauVar26 + 1;
            }
          }
          else if (alpha == 0) {
            iVar35 = uVar34 + iVar21;
            lVar31 = (long)sVar41 + -7;
            pauVar26 = (undefined1 (*) [32])local_240;
            for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
              iVar38 = iVar12;
              if (lVar31 < lVar16) {
                iVar38 = (int)lVar31;
              }
              if (lVar31 < 0) {
                iVar38 = 0;
              }
              iVar14 = iVar35 >> 10;
              lVar18 = (long)(iVar38 * stride + iVar22);
              auVar49._16_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar49._0_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              uVar3 = *(undefined4 *)av1_warped_filter[iVar14];
              auVar53._4_4_ = uVar3;
              auVar53._0_4_ = uVar3;
              auVar53._8_4_ = uVar3;
              auVar53._12_4_ = uVar3;
              auVar53._16_4_ = uVar3;
              auVar53._20_4_ = uVar3;
              auVar53._24_4_ = uVar3;
              auVar53._28_4_ = uVar3;
              uVar3 = *(undefined4 *)(av1_warped_filter[iVar14] + 2);
              auVar58._4_4_ = uVar3;
              auVar58._0_4_ = uVar3;
              auVar58._8_4_ = uVar3;
              auVar58._12_4_ = uVar3;
              auVar58._16_4_ = uVar3;
              auVar58._20_4_ = uVar3;
              auVar58._24_4_ = uVar3;
              auVar58._28_4_ = uVar3;
              uVar3 = *(undefined4 *)(av1_warped_filter[iVar14] + 4);
              auVar61._4_4_ = uVar3;
              auVar61._0_4_ = uVar3;
              auVar61._8_4_ = uVar3;
              auVar61._12_4_ = uVar3;
              auVar61._16_4_ = uVar3;
              auVar61._20_4_ = uVar3;
              auVar61._24_4_ = uVar3;
              auVar61._28_4_ = uVar3;
              uVar3 = *(undefined4 *)(av1_warped_filter[iVar14] + 6);
              auVar70._4_4_ = uVar3;
              auVar70._0_4_ = uVar3;
              auVar70._8_4_ = uVar3;
              auVar70._12_4_ = uVar3;
              auVar70._16_4_ = uVar3;
              auVar70._20_4_ = uVar3;
              auVar70._24_4_ = uVar3;
              auVar70._28_4_ = uVar3;
              auVar64 = vpalignr_avx2(auVar49,*(undefined1 (*) [32])(ref + lVar18 + -7),2);
              auVar52 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar18 + -7),auVar64,0x20);
              auVar49 = vpblendd_avx2(auVar49,auVar64,0xf0);
              auVar64 = vpalignr_avx2(auVar49,auVar52,4);
              auVar76 = vpmaddwd_avx2(auVar64,auVar58);
              auVar64 = vpalignr_avx2(auVar49,auVar52,8);
              auVar73 = vpmaddwd_avx2(auVar64,auVar61);
              auVar77 = vpmaddwd_avx2(auVar52,auVar53);
              auVar64 = vpalignr_avx2(auVar49,auVar52,0xc);
              auVar64 = vpmaddwd_avx2(auVar70,auVar64);
              auVar64 = vpaddd_avx2(auVar73,auVar64);
              auVar73 = vpaddd_avx2(auVar77,auVar47);
              auVar73 = vpaddd_avx2(auVar73,auVar76);
              auVar64 = vpaddd_avx2(auVar73,auVar64);
              auVar64 = vpsrad_avx2(auVar64,auVar46);
              *pauVar26 = auVar64;
              iVar35 = iVar35 + iVar29;
              lVar31 = lVar31 + 1;
              pauVar26 = pauVar26 + 1;
            }
          }
          else if (beta == 0) {
            auVar74._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 + iVar35 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38];
            auVar74._16_16_ =
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 + iVar35 >> 10];
            auVar62._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 * 3 + iVar35 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 * 2 + iVar35 >> 10];
            auVar62._16_16_ =
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 * 3 + iVar35 >> 10];
            auVar50._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 * 5 + iVar35 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 * 4 + iVar35 >> 10];
            auVar50._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 * 5 + iVar35 >> 10];
            auVar54._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar35 + iVar36 * 7 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 * 6 + iVar35 >> 10];
            auVar54._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar35 + iVar36 * 7 >> 10];
            auVar76 = vpunpckldq_avx2(auVar74,auVar62);
            auVar64 = vpunpckhdq_avx2(auVar74,auVar62);
            auVar77 = vpunpckldq_avx2(auVar50,auVar54);
            auVar73 = vpunpckhdq_avx2(auVar50,auVar54);
            auVar49 = vpunpcklqdq_avx2(auVar76,auVar77);
            auVar76 = vpunpckhqdq_avx2(auVar76,auVar77);
            auVar77 = vpunpcklqdq_avx2(auVar64,auVar73);
            auVar64 = vpunpckhqdq_avx2(auVar64,auVar73);
            lVar31 = (long)sVar41 + -7;
            pauVar26 = (undefined1 (*) [32])local_240;
            for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
              iVar35 = iVar12;
              if (lVar31 < lVar16) {
                iVar35 = (int)lVar31;
              }
              if (lVar31 < 0) {
                iVar35 = 0;
              }
              lVar18 = (long)(iVar35 * stride + iVar22);
              auVar55._16_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar55._0_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar73 = vpalignr_avx2(auVar55,*(undefined1 (*) [32])(ref + lVar18 + -7),2);
              auVar70 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar18 + -7),auVar73,0x20);
              auVar61 = vpblendd_avx2(auVar55,auVar73,0xf0);
              auVar52 = vpmaddwd_avx2(auVar49,auVar70);
              auVar73 = vpalignr_avx2(auVar61,auVar70,4);
              auVar53 = vpmaddwd_avx2(auVar76,auVar73);
              auVar73 = vpalignr_avx2(auVar61,auVar70,8);
              auVar58 = vpmaddwd_avx2(auVar77,auVar73);
              auVar73 = vpalignr_avx2(auVar61,auVar70,0xc);
              auVar73 = vpmaddwd_avx2(auVar64,auVar73);
              auVar73 = vpaddd_avx2(auVar58,auVar73);
              auVar52 = vpaddd_avx2(auVar52,auVar47);
              auVar52 = vpaddd_avx2(auVar53,auVar52);
              auVar73 = vpaddd_avx2(auVar52,auVar73);
              auVar73 = vpsrad_avx2(auVar73,auVar46);
              *pauVar26 = auVar73;
              lVar31 = lVar31 + 1;
              pauVar26 = pauVar26 + 1;
            }
          }
          else {
            lVar31 = (long)sVar41 + -7;
            iVar35 = uVar34 + iVar21;
            pauVar26 = (undefined1 (*) [32])local_240;
            for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
              iVar38 = iVar12;
              if (lVar31 < lVar16) {
                iVar38 = (int)lVar31;
              }
              if (lVar31 < 0) {
                iVar38 = 0;
              }
              auVar72._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 + iVar35 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar35 >> 10];
              auVar72._16_16_ =
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 + iVar35 >> 10];
              iVar14 = iVar36 * 2 + iVar35;
              iVar30 = iVar36 + iVar14;
              iVar15 = iVar36 + iVar30;
              auVar60._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar14 >> 10];
              auVar60._16_16_ = ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 >> 10];
              iVar30 = iVar36 + iVar15;
              iVar14 = iVar36 + iVar30;
              auVar75._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar15 >> 10];
              auVar75._16_16_ = ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 >> 10];
              auVar48._0_16_ =
                   ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar36 + iVar14 >> 10] +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar14 >> 10];
              auVar48._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar36 + iVar14 >> 10];
              lVar18 = (long)(iVar38 * stride + iVar22);
              auVar57._16_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar57._0_16_ = *(undefined1 (*) [16])(ref + lVar18 + 1);
              auVar76 = vpunpckldq_avx2(auVar72,auVar60);
              auVar64 = vpunpckhdq_avx2(auVar72,auVar60);
              auVar77 = vpunpckldq_avx2(auVar75,auVar48);
              auVar73 = vpunpckhdq_avx2(auVar75,auVar48);
              auVar52 = vpunpcklqdq_avx2(auVar76,auVar77);
              auVar77 = vpunpckhqdq_avx2(auVar76,auVar77);
              auVar53 = vpunpcklqdq_avx2(auVar64,auVar73);
              auVar49 = vpunpckhqdq_avx2(auVar64,auVar73);
              auVar64 = vpalignr_avx2(auVar57,*(undefined1 (*) [32])(ref + lVar18 + -7),2);
              auVar61 = vperm2i128_avx2(*(undefined1 (*) [32])(ref + lVar18 + -7),auVar64,0x20);
              auVar58 = vpblendd_avx2(auVar57,auVar64,0xf0);
              auVar76 = vpmaddwd_avx2(auVar52,auVar61);
              auVar64 = vpalignr_avx2(auVar58,auVar61,4);
              auVar73 = vpmaddwd_avx2(auVar77,auVar64);
              auVar64 = vpalignr_avx2(auVar58,auVar61,8);
              auVar64 = vpmaddwd_avx2(auVar53,auVar64);
              auVar64 = vpaddd_avx2(auVar73,auVar64);
              auVar73 = vpalignr_avx2(auVar58,auVar61,0xc);
              auVar77 = vpmaddwd_avx2(auVar49,auVar73);
              auVar73 = vpaddd_avx2(auVar76,auVar47);
              auVar64 = vpaddd_avx2(auVar64,auVar73);
              auVar64 = vpaddd_avx2(auVar64,auVar77);
              auVar64 = vpsrad_avx2(auVar64,auVar46);
              *pauVar26 = auVar64;
              lVar31 = lVar31 + 1;
              iVar35 = iVar35 + iVar29;
              pauVar26 = pauVar26 + 1;
            }
          }
        }
      }
      else {
        lVar31 = (long)sVar41 + -7;
        pauVar26 = (undefined1 (*) [32])local_240;
        for (lVar17 = -7; lVar17 < lVar25; lVar17 = lVar17 + 1) {
          iVar22 = iVar12;
          if (lVar31 < lVar16) {
            iVar22 = (int)lVar31;
          }
          if (lVar31 < 0) {
            iVar22 = 0;
          }
          auVar46._0_2_ =
               (undefined2)(((uint)ref[iVar22 * stride + iVar32] << (7 - bVar7 & 0x1f)) + iVar13);
          auVar46._2_2_ = auVar46._0_2_;
          auVar46._4_2_ = auVar46._0_2_;
          auVar46._6_2_ = auVar46._0_2_;
          auVar46._8_2_ = auVar46._0_2_;
          auVar46._10_2_ = auVar46._0_2_;
          auVar46._12_2_ = auVar46._0_2_;
          auVar46._14_2_ = auVar46._0_2_;
          auVar64 = vpmovsxwd_avx2(auVar46);
          *pauVar26 = auVar64;
          lVar31 = lVar31 + 1;
          pauVar26 = pauVar26 + 1;
        }
      }
      iVar38 = (((uint)lVar37 & 0xfffc) + (delta + iVar33) * -4 & 0xffffffc0) + 0x10200;
      pauVar26 = (undefined1 (*) [32])local_160;
      iVar22 = local_3dc;
      iVar35 = iVar42;
      for (lVar17 = -4; lVar17 < iVar43 + -4; lVar17 = lVar17 + 1) {
        auVar71._0_16_ =
             ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar33 + iVar38 >> 10] +
             ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar38 >> 10];
        auVar71._16_16_ = ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar33 + iVar38 >> 10];
        iVar14 = iVar33 * 2 + iVar38;
        iVar30 = iVar33 + iVar14;
        iVar15 = iVar33 + iVar30;
        auVar63._0_16_ =
             ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 >> 10] +
             ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar14 >> 10];
        auVar63._16_16_ = ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 >> 10];
        iVar30 = iVar33 + iVar15;
        iVar14 = iVar33 + iVar30;
        auVar51._0_16_ =
             ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar30 >> 10] +
             ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar15 >> 10];
        auVar51._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar30 >> 10];
        auVar56._0_16_ =
             ZEXT116(0) * (undefined1  [16])av1_warped_filter[iVar33 + iVar14 >> 10] +
             ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar14 >> 10];
        auVar56._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * (undefined1  [16])av1_warped_filter[iVar33 + iVar14 >> 10];
        auVar76 = vpunpckldq_avx2(auVar71,auVar63);
        auVar64 = vpunpckhdq_avx2(auVar71,auVar63);
        auVar77 = vpunpckldq_avx2(auVar51,auVar56);
        auVar73 = vpunpckhdq_avx2(auVar51,auVar56);
        auVar49 = vpunpcklqdq_avx2(auVar76,auVar77);
        auVar76 = vpunpckhqdq_avx2(auVar76,auVar77);
        auVar52 = vpunpcklqdq_avx2(auVar64,auVar73);
        auVar77 = vpunpckhqdq_avx2(auVar64,auVar73);
        auVar73 = vpunpckldq_avx2(pauVar26[-7],pauVar26[-6]);
        auVar64 = vpunpckhdq_avx2(pauVar26[-7],pauVar26[-6]);
        auVar64 = vpackusdw_avx2(auVar73,auVar64);
        auVar73 = vpmaddwd_avx2(auVar64,auVar49);
        auVar49 = vpunpckldq_avx2(pauVar26[-5],pauVar26[-4]);
        auVar64 = vpunpckhdq_avx2(pauVar26[-5],pauVar26[-4]);
        auVar64 = vpackusdw_avx2(auVar49,auVar64);
        auVar64 = vpmaddwd_avx2(auVar64,auVar76);
        auVar73 = vpaddd_avx2(auVar64,auVar73);
        auVar76 = vpunpckldq_avx2(pauVar26[-3],pauVar26[-2]);
        auVar64 = vpunpckhdq_avx2(pauVar26[-3],pauVar26[-2]);
        auVar64 = vpackusdw_avx2(auVar76,auVar64);
        auVar76 = vpmaddwd_avx2(auVar52,auVar64);
        auVar49 = vpunpckldq_avx2(pauVar26[-1],*pauVar26);
        auVar64 = vpunpckhdq_avx2(pauVar26[-1],*pauVar26);
        auVar64 = vpackusdw_avx2(auVar49,auVar64);
        auVar64 = vpmaddwd_avx2(auVar64,auVar77);
        auVar64 = vpaddd_avx2(auVar76,auVar64);
        auVar64 = vpaddd_avx2(auVar73,auVar64);
        auVar64 = vpermd_avx2(auVar5,auVar64);
        if (conv_params->is_compound == 0) {
          auVar64 = vpaddd_avx2(auVar67,auVar64);
          auVar64 = vpsrad_avx2(auVar64,ZEXT416(uVar20));
          auVar46 = vpackusdw_avx(auVar64._0_16_,auVar64._16_16_);
          auVar46 = vpminsw_avx(auVar69,auVar46);
          auVar46 = vpmaxsw_avx(auVar46,_DAT_004240f0);
LAB_003cdaa0:
          *(undefined1 (*) [16])(pred + iVar22) = auVar46;
        }
        else {
          iVar14 = conv_params->dst_stride * iVar35 + iVar23;
          auVar64 = vpaddd_avx2(auVar64,auVar65);
          auVar64 = vpsrad_avx2(auVar64,ZEXT416(uVar20));
          if (conv_params->do_average != 0) {
            auVar73 = vpmovzxwd_avx2(*(undefined1 (*) [16])(conv_params->dst + iVar14));
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              auVar64 = vpaddd_avx2(auVar73,auVar64);
              auVar64 = vpsrad_avx2(auVar64,1);
            }
            else {
              auVar10._4_4_ = iVar1;
              auVar10._0_4_ = iVar1;
              auVar10._8_4_ = iVar1;
              auVar10._12_4_ = iVar1;
              auVar10._16_4_ = iVar1;
              auVar10._20_4_ = iVar1;
              auVar10._24_4_ = iVar1;
              auVar10._28_4_ = iVar1;
              auVar73 = vpmulld_avx2(auVar73,auVar10);
              auVar9._4_4_ = iVar2;
              auVar9._0_4_ = iVar2;
              auVar9._8_4_ = iVar2;
              auVar9._12_4_ = iVar2;
              auVar9._16_4_ = iVar2;
              auVar9._20_4_ = iVar2;
              auVar9._24_4_ = iVar2;
              auVar9._28_4_ = iVar2;
              auVar64 = vpmulld_avx2(auVar64,auVar9);
              auVar64 = vpaddd_avx2(auVar73,auVar64);
              auVar64 = vpsrad_avx2(auVar64,4);
            }
            auVar64 = vpaddd_avx2(auVar64,auVar66);
            auVar64 = vpsrad_avx2(auVar64,ZEXT416(uVar45));
            auVar46 = vpackusdw_avx(auVar64._0_16_,auVar64._16_16_);
            auVar11._2_2_ = uVar27;
            auVar11._0_2_ = uVar27;
            auVar11._4_2_ = uVar27;
            auVar11._6_2_ = uVar27;
            auVar11._8_2_ = uVar27;
            auVar11._10_2_ = uVar27;
            auVar11._12_2_ = uVar27;
            auVar11._14_2_ = uVar27;
            auVar46 = vpminsw_avx(auVar46,auVar11);
            goto LAB_003cdaa0;
          }
          auVar46 = vpackusdw_avx(auVar64._0_16_,auVar64._16_16_);
          *(undefined1 (*) [16])(conv_params->dst + iVar14) = auVar46;
        }
        iVar22 = iVar22 + p_stride;
        iVar35 = iVar35 + 1;
        pauVar26 = pauVar26 + 1;
        iVar38 = iVar38 + delta;
      }
      local_3dc = local_3dc + 8;
    }
    iVar42 = iVar42 + 8;
    local_3f4 = local_3f4 + p_stride * 8;
  } while( true );
}

Assistant:

void av1_highbd_warp_affine_avx2(const int32_t *mat, const uint16_t *ref,
                                 int width, int height, int stride,
                                 uint16_t *pred, int p_col, int p_row,
                                 int p_width, int p_height, int p_stride,
                                 int subsampling_x, int subsampling_y, int bd,
                                 ConvolveParams *conv_params, int16_t alpha,
                                 int16_t beta, int16_t gamma, int16_t delta) {
  __m256i tmp[15];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const __m256i res_sub_const =
      _mm256_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                        (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m256i round_bits_const = _mm256_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);

  __m256i v_rbhoriz = _mm256_set1_epi32(1 << (reduce_bits_horiz - 1));
  __m256i v_zeros = _mm256_setzero_si256();
  int ohoriz = 1 << offset_bits_horiz;
  int mhoriz = 1 << max_bits_horiz;
  (void)mhoriz;
  int sx;

  for (int i = 0; i < p_height; i += 8) {
    for (int j = 0; j < p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int16_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int16_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      if (ix4 <= -7) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(_mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (ix4 >= width + 6) {
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm256_cvtepi16_epi32(
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz))));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        int32_t tmp1[8];
        for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
          const int iy = clamp(iy4 + k, 0, height - 1);

          sx = sx4 + beta * (k + 4);
          for (int l = -4; l < 4; ++l) {
            int ix = ix4 + l - 3;
            const int offs = sx >> WARPEDDIFF_PREC_BITS;
            const int16_t *coeffs = av1_warped_filter[offs];

            int32_t sum = 1 << offset_bits_horiz;
            for (int m = 0; m < 8; ++m) {
              const int sample_x = clamp(ix + m, 0, width - 1);
              sum += ref[iy * stride + sample_x] * coeffs[m];
            }
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
            tmp1[(l + 4) / 2 + ((l + 4) % 2) * 4] = sum;
            sx += alpha;
          }
          tmp[k + 7] = _mm256_loadu_si256((__m256i *)tmp1);
        }
      } else {
        if (beta == 0 && alpha == 0) {
          sx = sx4;
          __m128i v_01 = _mm_loadu_si128(
              (__m128i *)
                  av1_warped_filter[sx >>
                                    WARPEDDIFF_PREC_BITS]);  // A7A6A5A4A3A2A1A0
          __m256i v_c01 = _mm256_broadcastd_epi32(v_01);     // A1A0A1A0A1A0A1A0
          __m256i v_c23 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
          __m256i v_c45 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
          __m256i v_c67 = _mm256_broadcastd_epi32(
              _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (alpha == 0) {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m128i v_01 = _mm_loadu_si128(
                (__m128i *)av1_warped_filter
                    [sx >> WARPEDDIFF_PREC_BITS]);          // A7A6A5A4A3A2A1A0
            __m256i v_c01 = _mm256_broadcastd_epi32(v_01);  // A1A0A1A0A1A0A1A0
            __m256i v_c23 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 1));  // A3A2A3A2A3A2A3A2
            __m256i v_c45 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 2));  // A5A4A5A4A5A4A5A4
            __m256i v_c67 = _mm256_broadcastd_epi32(
                _mm_shuffle_epi32(v_01, 3));  // A7A6A7A6A7A6A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        } else if (beta == 0) {
          sx = sx4;
          __m256i v_coeff01 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff01 = _mm256_inserti128_si256(
              v_coeff01,
              _mm_loadu_si128(
                  (__m128i *)
                      av1_warped_filter[(sx + alpha) >> WARPEDDIFF_PREC_BITS]),
              1);  // B7B6..B1B0A7A6..A1A0
          __m256i v_coeff23 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff23 = _mm256_inserti128_si256(
              v_coeff23,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // D7D6..D1D0C7C6..C1C0
          __m256i v_coeff45 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff45 = _mm256_inserti128_si256(
              v_coeff45,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // F7F6..F1F0E7E6..E1E0
          __m256i v_coeff67 = _mm256_inserti128_si256(
              v_zeros,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              0);
          v_coeff67 = _mm256_inserti128_si256(
              v_coeff67,
              _mm_loadu_si128(
                  (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                               WARPEDDIFF_PREC_BITS]),
              1);  // H7H6..H1H0G7G6..G1G0

          __m256i v_c0123 = _mm256_unpacklo_epi32(
              v_coeff01,
              v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
          __m256i v_c0123u = _mm256_unpackhi_epi32(
              v_coeff01,
              v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
          __m256i v_c4567 = _mm256_unpacklo_epi32(
              v_coeff45,
              v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
          __m256i v_c4567u = _mm256_unpackhi_epi32(
              v_coeff45,
              v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

          __m256i v_c01 = _mm256_unpacklo_epi64(
              v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
          __m256i v_c23 =
              _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
          __m256i v_c45 =
              _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
          __m256i v_c67 =
              _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum = _mm256_madd_epi16(
                v_c01, _mm256_alignr_epi8(v_refu, v_refl,
                                          0));  // R8R7R6..R1R7R6R5..R1R0
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum = _mm256_madd_epi16(
                v_c23,
                _mm256_alignr_epi8(v_refu, v_refl, 4));  // R10R9..R3R9R8..R3R2
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum = _mm256_madd_epi16(
                v_c45, _mm256_alignr_epi8(v_refu, v_refl,
                                          8));  // R12R11..R5R11R10..R5R4
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(
                v_c67, _mm256_alignr_epi8(v_refu, v_refl,
                                          12));  // R14R13..R7R13R12..R7R6
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }

        } else {
          for (int k = -7; k < AOMMIN(8, p_height - i); ++k) {
            int iy = iy4 + k;
            if (iy < 0)
              iy = 0;
            else if (iy > height - 1)
              iy = height - 1;
            iy = iy * stride;

            sx = sx4 + beta * (k + 4);

            __m256i v_coeff01 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx) >> WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff01 = _mm256_inserti128_si256(
                v_coeff01,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // B7B6..B1B0A7A6..A1A0
            __m256i v_coeff23 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 2 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff23 = _mm256_inserti128_si256(
                v_coeff23,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 3 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // D7D6..D1D0C7C6..C1C0
            __m256i v_coeff45 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 4 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff45 = _mm256_inserti128_si256(
                v_coeff45,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 5 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // F7F6..F1F0E7E6..E1E0
            __m256i v_coeff67 = _mm256_inserti128_si256(
                v_zeros,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 6 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                0);
            v_coeff67 = _mm256_inserti128_si256(
                v_coeff67,
                _mm_loadu_si128(
                    (__m128i *)av1_warped_filter[(sx + 7 * alpha) >>
                                                 WARPEDDIFF_PREC_BITS]),
                1);  // H7H6..H1H0G7G6..G1G0

            __m256i v_c0123 = _mm256_unpacklo_epi32(
                v_coeff01,
                v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
            __m256i v_c0123u = _mm256_unpackhi_epi32(
                v_coeff01,
                v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
            __m256i v_c4567 = _mm256_unpacklo_epi32(
                v_coeff45,
                v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
            __m256i v_c4567u = _mm256_unpackhi_epi32(
                v_coeff45,
                v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

            __m256i v_c01 = _mm256_unpacklo_epi64(
                v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
            __m256i v_c23 =
                _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
            __m256i v_c45 =
                _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
            __m256i v_c67 =
                _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

            __m256i v_refl = _mm256_inserti128_si256(
                _mm256_setzero_si256(),
                _mm_loadu_si128((__m128i *)&ref[iy + ix4 - 7]), 0);
            v_refl = _mm256_inserti128_si256(
                v_refl, _mm_loadu_si128((__m128i *)&ref[iy + ix4 + 1]),
                1);  // R15 .. R0

            __m256i v_ref = _mm256_permute4x64_epi64(v_refl, 0xEE);

            __m256i v_refu =
                _mm256_alignr_epi8(v_ref, v_refl, 2);  // R8R15R14...R2R1

            v_refl = _mm256_inserti128_si256(
                v_refl, _mm256_extracti128_si256(v_refu, 0), 1);
            v_refu = _mm256_inserti128_si256(
                v_refu, _mm256_extracti128_si256(v_ref, 0), 0);

            __m256i v_sum = _mm256_set1_epi32(ohoriz);
            __m256i parsum =
                _mm256_madd_epi16(v_c01, _mm256_alignr_epi8(v_refu, v_refl, 0));
            __m256i v_sum1 = _mm256_add_epi32(v_sum, parsum);

            parsum =
                _mm256_madd_epi16(v_c23, _mm256_alignr_epi8(v_refu, v_refl, 4));
            __m256i v_sum2 = _mm256_add_epi32(v_sum1, parsum);
            parsum =
                _mm256_madd_epi16(v_c45, _mm256_alignr_epi8(v_refu, v_refl, 8));
            __m256i v_sum3 = _mm256_add_epi32(v_sum2, parsum);
            parsum = _mm256_madd_epi16(v_c67,
                                       _mm256_alignr_epi8(v_refu, v_refl, 12));
            __m256i v_sum4 = _mm256_add_epi32(v_sum3, parsum);

            tmp[k + 7] = _mm256_srai_epi32(_mm256_add_epi32(v_sum4, v_rbhoriz),
                                           reduce_bits_horiz);
          }
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        const __m256i *src = tmp + (k + 4);

        __m256i v_coeff01 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128(
                (__m128i *)av1_warped_filter[(sy) >> WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff01 = _mm256_inserti128_si256(
            v_coeff01,
            _mm_loadu_si128(
                (__m128i *)
                    av1_warped_filter[(sy + gamma) >> WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff23 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 2 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff23 = _mm256_inserti128_si256(
            v_coeff23,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 3 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff45 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 4 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff45 = _mm256_inserti128_si256(
            v_coeff45,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 5 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);
        __m256i v_coeff67 = _mm256_inserti128_si256(
            v_zeros,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 6 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            0);
        v_coeff67 = _mm256_inserti128_si256(
            v_coeff67,
            _mm_loadu_si128((__m128i *)av1_warped_filter[(sy + 7 * gamma) >>
                                                         WARPEDDIFF_PREC_BITS]),
            1);

        __m256i v_c0123 = _mm256_unpacklo_epi32(
            v_coeff01,
            v_coeff23);  // D3D2B3B2D1D0B1B0C3C2A3A2C1C0A1A0
        __m256i v_c0123u = _mm256_unpackhi_epi32(
            v_coeff01,
            v_coeff23);  // D7D6B7B6D5D4B5B4C7C6A7A6C5C4A5A4
        __m256i v_c4567 = _mm256_unpacklo_epi32(
            v_coeff45,
            v_coeff67);  // H3H2F3F2H1H0F1F0G3G2E3E2G1G0E1E0
        __m256i v_c4567u = _mm256_unpackhi_epi32(
            v_coeff45,
            v_coeff67);  // H7H6F7F6H5H4F5F4G7G6E7E6G5G4E5E4

        __m256i v_c01 = _mm256_unpacklo_epi64(
            v_c0123, v_c4567);  // H1H0F1F0D1D0B1B0G1G0E1E0C1C0A1A0
        __m256i v_c23 =
            _mm256_unpackhi_epi64(v_c0123, v_c4567);  // H3H2 ... A3A2
        __m256i v_c45 =
            _mm256_unpacklo_epi64(v_c0123u, v_c4567u);  // H5H4 ... A5A4
        __m256i v_c67 =
            _mm256_unpackhi_epi64(v_c0123u, v_c4567u);  // H7H6 ... A7A6

        __m256i v_src01l =
            _mm256_unpacklo_epi32(src[0], src[1]);  // T13T03T11T01T12T02T10T00
        __m256i v_src01u =
            _mm256_unpackhi_epi32(src[0], src[1]);  // T17T07T15T05T16T06T14T04
        __m256i v_sum =
            _mm256_madd_epi16(_mm256_packus_epi32(v_src01l, v_src01u),
                              v_c01);  // S7S5S3S1S6S4S2S0

        __m256i v_src23l = _mm256_unpacklo_epi32(src[2], src[3]);
        __m256i v_src23u = _mm256_unpackhi_epi32(src[2], src[3]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src23l, v_src23u), v_c23));

        __m256i v_src45l = _mm256_unpacklo_epi32(src[4], src[5]);
        __m256i v_src45u = _mm256_unpackhi_epi32(src[4], src[5]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src45l, v_src45u), v_c45));

        __m256i v_src67l = _mm256_unpacklo_epi32(src[6], src[7]);
        __m256i v_src67u = _mm256_unpackhi_epi32(src[6], src[7]);
        v_sum = _mm256_add_epi32(
            v_sum,
            _mm256_madd_epi16(_mm256_packus_epi32(v_src67l, v_src67u), v_c67));

        // unpack S7S5S3S1S6S4S2S0 to S7S6S5S4S3S2S1S0

        __m256i v_suml =
            _mm256_permute4x64_epi64(v_sum, 0xD8);  // S7S5S6S4S3S1S2S0
        __m256i v_sumh =
            _mm256_permute4x64_epi64(v_sum, 0x32);      // S2S0S7S5S2S0S3S1
        v_sum = _mm256_unpacklo_epi32(v_suml, v_sumh);  // S7S6S5S4S3S2S1S0

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];

          v_sum = _mm256_add_epi32(v_sum, res_add_const);
          v_sum =
              _mm256_sra_epi32(_mm256_add_epi32(v_sum, reduce_bits_vert_const),
                               reduce_bits_vert_shift);
          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m256i p_32 = _mm256_cvtepu16_epi32(_mm_loadu_si128(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              v_sum = _mm256_add_epi32(_mm256_mullo_epi32(p_32, wt0),
                                       _mm256_mullo_epi32(v_sum, wt1));
              v_sum = _mm256_srai_epi32(v_sum, DIST_PRECISION_BITS);
            } else {
              v_sum = _mm256_srai_epi32(_mm256_add_epi32(p_32, v_sum), 1);
            }

            __m256i v_sum1 = _mm256_add_epi32(v_sum, res_sub_const);
            v_sum1 = _mm256_sra_epi32(
                _mm256_add_epi32(v_sum1, round_bits_const), round_bits_shift);

            __m256i v_sum16 = _mm256_packus_epi32(v_sum1, v_sum1);
            v_sum16 = _mm256_permute4x64_epi64(v_sum16, 0xD8);
            v_sum16 = _mm256_min_epi16(v_sum16, clip_pixel);
            _mm_storeu_si128(dst16, _mm256_extracti128_si256(v_sum16, 0));
          } else {
            v_sum = _mm256_packus_epi32(v_sum, v_sum);
            __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum, 0xD8);
            _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
          }
        } else {
          // Round and pack into 8 bits
          const __m256i round_const =
              _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                ((1 << reduce_bits_vert) >> 1));

          __m256i v_sum1 = _mm256_srai_epi32(
              _mm256_add_epi32(v_sum, round_const), reduce_bits_vert);

          v_sum1 = _mm256_packus_epi32(v_sum1, v_sum1);
          __m256i v_sum16 = _mm256_permute4x64_epi64(v_sum1, 0xD8);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m256i max_val = _mm256_set1_epi16((1 << bd) - 1);
          const __m256i zero = _mm256_setzero_si256();
          v_sum16 = _mm256_max_epi16(_mm256_min_epi16(v_sum16, max_val), zero);

          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          _mm_storeu_si128(p, _mm256_extracti128_si256(v_sum16, 0));
        }
      }
    }
  }
}